

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  long in_FS_OFFSET;
  int local_8c;
  int n;
  int s;
  int Y;
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  char zBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  x._40_8_ = argv;
  iVar5 = isDate(context,argc,argv,(DateTime *)&s);
  if (iVar5 == 0) {
    computeYMD_HMS((DateTime *)&s);
    n = (int)x.iJD;
    if ((int)x.iJD < 0) {
      n = -(int)x.iJD;
    }
    context_local._1_1_ =
         (char)((long)((ulong)(uint)((int)((long)n / 1000) >> 0x1f) << 0x20 |
                      (long)n / 1000 & 0xffffffffU) % 10) + '0';
    context_local._2_1_ =
         (char)((long)((ulong)(uint)((int)((long)n / 100) >> 0x1f) << 0x20 |
                      (long)n / 100 & 0xffffffffU) % 10) + '0';
    context_local._3_1_ =
         (char)((long)((ulong)(uint)((int)((long)n / 10) >> 0x1f) << 0x20 |
                      (long)n / 10 & 0xffffffffU) % 10) + '0';
    context_local._4_1_ = (char)(n % 10) + '0';
    context_local._5_1_ = 0x2d;
    context_local._6_1_ =
         (char)((long)((ulong)(uint)((int)((long)x.iJD._4_4_ / 10) >> 0x1f) << 0x20 |
                      (long)x.iJD._4_4_ / 10 & 0xffffffffU) % 10) + '0';
    context_local._7_1_ = (char)(x.iJD._4_4_ % 10) + '0';
    zBuf[0] = '-';
    zBuf[1] = (char)((long)((ulong)(uint)((int)((long)x.Y / 10) >> 0x1f) << 0x20 |
                           (long)x.Y / 10 & 0xffffffffU) % 10) + '0';
    zBuf[2] = (char)(x.Y % 10) + '0';
    zBuf[3] = ' ';
    zBuf[4] = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                           (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    zBuf[5] = (char)(x.M % 10) + '0';
    zBuf[6] = ':';
    zBuf[7] = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                           (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    zBuf[8] = (char)(x.D % 10) + '0';
    zBuf[9] = ':';
    if (x.s._7_1_ == '\0') {
      uVar2 = (long)(int)(double)x._24_8_ / 10;
      cVar3 = (char)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 10);
      cVar4 = (char)((int)(double)x._24_8_ % 10);
      zBuf[0xc] = '\0';
      local_8c = 0x14;
    }
    else {
      iVar5 = (int)((double)x._24_8_ * 1000.0 + 0.5);
      cVar3 = (char)((long)((ulong)(uint)((int)((long)iVar5 / 10000) >> 0x1f) << 0x20 |
                           (long)iVar5 / 10000 & 0xffffffffU) % 10);
      cVar4 = (char)((long)((ulong)(uint)((int)((long)iVar5 / 1000) >> 0x1f) << 0x20 |
                           (long)iVar5 / 1000 & 0xffffffffU) % 10);
      zBuf[0xc] = '.';
      zBuf[0xd] = (char)((long)((ulong)(uint)((int)((long)iVar5 / 100) >> 0x1f) << 0x20 |
                               (long)iVar5 / 100 & 0xffffffffU) % 10) + '0';
      zBuf[0xe] = (char)((long)((ulong)(uint)((int)((long)iVar5 / 10) >> 0x1f) << 0x20 |
                               (long)iVar5 / 10 & 0xffffffffU) % 10) + '0';
      zBuf[0xf] = (char)(iVar5 % 10) + '0';
      zBuf[0x10] = '\0';
      local_8c = 0x18;
    }
    zBuf[0xb] = cVar4 + '0';
    zBuf[10] = cVar3 + '0';
    if ((int)x.iJD < 0) {
      context_local._0_1_ = 0x2d;
      sqlite3_result_text(context,(char *)&context_local,local_8c,
                          (_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(context,(char *)((long)&context_local + 1),local_8c + -1,
                          (_func_void_void_ptr *)0xffffffffffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}